

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O2

QSize __thiscall QDockWidgetItem::maximumSize(QDockWidgetItem *this)

{
  QLayoutItem *pQVar1;
  QDockWidgetLayout *this_00;
  Representation extraout_var;
  QSize QVar2;
  long in_FS_OFFSET;
  QSize local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = dockWidgetChildItem(this);
  if (pQVar1 == (QLayoutItem *)0x0) {
    QVar2.wd.m_i = 0xffffff;
    QVar2.ht.m_i = 0xffffff;
  }
  else {
    this_00 = dockWidgetLayout(this);
    local_20.wd.m_i = (*pQVar1->_vptr_QLayoutItem[4])(pQVar1);
    local_20.ht.m_i = extraout_var.m_i;
    QVar2 = QDockWidgetLayout::sizeFromContent(this_00,&local_20,false);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QSize QDockWidgetItem::maximumSize() const
{
    if (QLayoutItem *item = dockWidgetChildItem()) {
        return dockWidgetLayout()->sizeFromContent(item->maximumSize(), false);
    } else {
        return QSize(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX);
    }
}